

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiMenuColumns::Update(ImGuiMenuColumns *this,int count,float spacing,bool clear)

{
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  int in_XMM0_Da;
  int i;
  int local_18;
  
  *in_RDI = in_ESI;
  in_RDI[3] = 0;
  in_RDI[2] = 0;
  in_RDI[1] = in_XMM0_Da;
  if ((in_DL & 1) != 0) {
    memset(in_RDI + 8,0,0x10);
  }
  for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
    if ((0 < local_18) && (0.0 < (float)in_RDI[(long)local_18 + 8])) {
      in_RDI[2] = (int)((float)in_RDI[1] + (float)in_RDI[2]);
    }
    in_RDI[(long)local_18 + 4] = (int)(float)(int)(float)in_RDI[2];
    in_RDI[2] = (int)((float)in_RDI[(long)local_18 + 8] + (float)in_RDI[2]);
    in_RDI[(long)local_18 + 8] = 0;
  }
  return;
}

Assistant:

void ImGuiMenuColumns::Update(int count, float spacing, bool clear)
{
    IM_ASSERT(Count <= IM_ARRAYSIZE(Pos));
    Count = count;
    Width = NextWidth = 0.0f;
    Spacing = spacing;
    if (clear) memset(NextWidths, 0, sizeof(NextWidths));
    for (int i = 0; i < Count; i++)
    {
        if (i > 0 && NextWidths[i] > 0.0f)
            Width += Spacing;
        Pos[i] = (float)(int)Width;
        Width += NextWidths[i];
        NextWidths[i] = 0.0f;
    }
}